

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_clip.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdClipRect::emulate_mthd(MthdClipRect *this)

{
  pgraph_state *ppVar1;
  uint32_t *puVar2;
  int iVar3;
  uint uVar4;
  uint32_t val;
  uint uVar5;
  
  iVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type;
  if (2 < iVar3) {
    ppVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
    val = (this->super_SingleMthdTest).super_MthdTest.val;
    if (iVar3 == 3) {
      nv03_pgraph_set_clip
                (ppVar1,this->which_clip,2,val,
                 (_Bool)((byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                               xy_misc_1[0] & 1));
      return;
    }
    nv04_pgraph_set_clip(ppVar1,this->which_clip,2,val);
    return;
  }
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.chipset.card_type;
  if ((int)uVar4 < 3) {
    uVar5 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.access >> 0xc;
  }
  else {
    if (uVar4 != 3) {
      iVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.chipset.chipset;
      if (iVar3 < 0x25 || iVar3 == 0x2a) {
        uVar5 = (uint)(byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                            ctx_switch_a;
      }
      else {
        uVar5 = (uint)(ushort)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                              ctx_switch_a;
        if (uVar4 < 0x40) {
          uVar5 = uVar5 & 0xfff;
        }
      }
      goto LAB_001ad3c7;
    }
    uVar5 = (uint)*(ushort *)
                   ((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_user
                   + 2);
  }
  uVar5 = uVar5 & 0x1f;
LAB_001ad3c7:
  ppVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  if (uVar5 == 0x10) {
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0];
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
         ((uVar4 & 0x1000000) << 4 | uVar4 & 0xeeffffff) ^ 0x10000000;
    puVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1;
    *puVar2 = *puVar2 & 0x3000331;
    nv01_pgraph_vtx_fixup
              (ppVar1,0,2,(uint)(ushort)(this->super_SingleMthdTest).super_MthdTest.val,1,0,2);
    nv01_pgraph_vtx_fixup
              (ppVar1,1,2,
               (uint)*(ushort *)((long)&(this->super_SingleMthdTest).super_MthdTest.val + 2),1,0,2);
    nv01_pgraph_vtx_fixup
              (ppVar1,0,3,(uint)(ushort)(this->super_SingleMthdTest).super_MthdTest.val,1,1,3);
    nv01_pgraph_vtx_fixup
              (ppVar1,1,3,
               (uint)*(ushort *)((long)&(this->super_SingleMthdTest).super_MthdTest.val + 2),1,1,3);
    pgraph_prep_draw(ppVar1,false,false);
    return;
  }
  nv01_pgraph_set_clip(ppVar1,1,(this->super_SingleMthdTest).super_MthdTest.val);
  return;
}

Assistant:

void MthdClipRect::emulate_mthd() {
	if (chipset.card_type < 3) {
		if (pgraph_class(&exp) == 0x10) {
			int n = extr(exp.valid[0], 24, 1);
			insrt(exp.valid[0], 24, 1, 0);
			insrt(exp.valid[0], 28, 1, !n);
			exp.xy_misc_1[0] &= 0x03000331;
			nv01_pgraph_vtx_fixup(&exp, 0, 2, extr(val, 0, 16), 1, 0, 2);
			nv01_pgraph_vtx_fixup(&exp, 1, 2, extr(val, 16, 16), 1, 0, 2);
			nv01_pgraph_vtx_fixup(&exp, 0, 3, extr(val, 0, 16), 1, 1, 3);
			nv01_pgraph_vtx_fixup(&exp, 1, 3, extr(val, 16, 16), 1, 1, 3);
			pgraph_prep_draw(&exp, false, false);
		} else {
			nv01_pgraph_set_clip(&exp, 1, val);
		}
	} else if (chipset.card_type < 4) {
		nv03_pgraph_set_clip(&exp, which_clip, 2, val, extr(orig.xy_misc_1[0], 0, 1));
	} else {
		nv04_pgraph_set_clip(&exp, which_clip, 2, val);
	}
}